

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  long lVar1;
  sqlite3_vtab *psVar2;
  uint uVar3;
  int iVar4;
  RtreeSearchPoint *pStmt;
  sqlite3 *db;
  int in_EDX;
  sqlite3_context *in_RSI;
  RtreeCursor *in_RDI;
  long in_FS_OFFSET;
  RtreeNode *pNode;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  int rc;
  RtreeCoord c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Rtree *in_stack_ffffffffffffff90;
  RtreeNode *in_stack_ffffffffffffff98;
  Rtree *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int local_14;
  int local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (in_RDI->base).pVtab;
  pStmt = rtreeSearchPointFirst(in_RDI);
  db = (sqlite3 *)
       rtreeNodeOfFirstSearchPoint
                 ((RtreeCursor *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  if (pStmt == (RtreeSearchPoint *)0x0) {
    local_14 = 0;
  }
  else {
    uVar3 = (uint)pStmt->iCell;
    iVar4 = readInt16((u8 *)((db->mutex->mutex).__size + 2));
    if ((int)uVar3 < iVar4) {
      if (in_EDX == 0) {
        nodeGetRowid(in_stack_ffffffffffffff90,
                     (RtreeNode *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
        sqlite3_result_int64
                  ((sqlite3_context *)in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      else if ((int)(uint)(byte)psVar2[1].field_0xd < in_EDX) {
        if (in_RDI->bAuxValid == '\0') {
          if ((in_RDI->pReadAux == (sqlite3_stmt *)0x0) &&
             (local_14 = sqlite3_prepare_v3(db,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),
                                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                            (uint)in_stack_ffffffffffffffa0,
                                            (sqlite3_stmt **)in_stack_ffffffffffffff98,
                                            (char **)in_stack_ffffffffffffff90), local_14 != 0))
          goto LAB_0029832d;
          iVar4 = (int)((ulong)in_RDI->pReadAux >> 0x20);
          nodeGetRowid(in_stack_ffffffffffffff90,
                       (RtreeNode *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0)
          ;
          sqlite3_bind_int64((sqlite3_stmt *)in_stack_ffffffffffffffa0,iVar4,
                             (sqlite_int64)in_stack_ffffffffffffff90);
          local_10 = sqlite3_step((sqlite3_stmt *)pStmt);
          if (local_10 != 100) {
            sqlite3_reset((sqlite3_stmt *)in_stack_ffffffffffffffa0);
            if (local_10 == 0x65) {
              local_10 = 0;
            }
            local_14 = local_10;
            goto LAB_0029832d;
          }
          in_RDI->bAuxValid = '\x01';
        }
        sqlite3_column_value((sqlite3_stmt *)in_RSI,in_stack_ffffffffffffff8c);
        sqlite3_result_value
                  (in_RSI,(sqlite3_value *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      else {
        nodeGetCoord(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                     (RtreeCoord *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (psVar2[1].field_0xe == '\0') {
          sqlite3_result_double
                    ((sqlite3_context *)in_stack_ffffffffffffff90,
                     (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        else {
          sqlite3_result_int((sqlite3_context *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
          ;
        }
      }
      local_14 = 0;
    }
    else {
      local_14 = 4;
    }
  }
LAB_0029832d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( NEVER(p==0) ) return SQLITE_OK;
  if( p->iCell>=NCELL(pNode) ) return SQLITE_ABORT;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1,
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }
  return SQLITE_OK;
}